

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O3

DictionaryEntry * DictionaryEntry::CreateInstance(DictionaryEntryType item_type)

{
  DictionaryEntry *pDVar1;
  undefined *puVar2;
  
  pDVar1 = (DictionaryEntry *)0x0;
  switch(item_type) {
  case Boolean:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined1 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<bool>::vtable;
    break;
  case UInt8:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined1 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<unsigned_char>::vtable;
    break;
  case Int8:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined1 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<signed_char>::vtable;
    break;
  case Int16:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined2 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<short>::vtable;
    break;
  case UInt16:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined2 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<unsigned_short>::vtable;
    break;
  case Int32:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined4 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<int>::vtable;
    break;
  case UInt32:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined4 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<unsigned_int>::vtable;
    break;
  case Int64:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<long>::vtable;
    break;
  case Float:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined4 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<float>::vtable;
    break;
  case Double:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<double>::vtable;
    break;
  case Uuid:
    pDVar1 = (DictionaryEntry *)operator_new(0x18);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_UUID_struct>::vtable;
    break;
  case String:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    pDVar1->_vptr_DictionaryEntry = (_func_int **)&PTR__DictionaryEntryT_00809bd8;
    ON_wString::ON_wString((ON_wString *)(pDVar1 + 1));
    puVar2 = &Entry<ON_wString>::vtable;
    break;
  case BooleanArray:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_SimpleArray_00809cc8;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_SimpleArray<bool>>::vtable;
    break;
  case UInt8Array:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_SimpleArray_00809db8;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_SimpleArray<unsigned_char>>::vtable;
    break;
  case Int8Array:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_SimpleArray_00809ea8;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_SimpleArray<signed_char>>::vtable;
    break;
  case Int16Array:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_SimpleArray_00809f98;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_SimpleArray<short>>::vtable;
    break;
  case Int32Array:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_SimpleArray<int>>::vtable;
    break;
  case FloatArray:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_SimpleArray_0080a138;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_SimpleArray<float>>::vtable;
    break;
  case DoubleArray:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_SimpleArray_0080a228;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_SimpleArray<double>>::vtable;
    break;
  case UuidArray:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_SimpleArray_0080a318;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_SimpleArray<ON_UUID_struct>>::vtable;
    break;
  case StringArray:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR__ON_ClassArray_00808f88;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_ClassArray<ON_wString>>::vtable;
    break;
  case Color:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    *(undefined4 *)&pDVar1[1]._vptr_DictionaryEntry = 0;
    puVar2 = &Entry<ON_Color>::vtable;
    break;
  case Point2i:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_2iPoint>::vtable;
    break;
  case Point2f:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_2fPoint>::vtable;
    break;
  case Rect4i:
    pDVar1 = (DictionaryEntry *)operator_new(0x18);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_4iRect>::vtable;
    break;
  default:
    goto switchD_0038c0a5_caseD_1a;
  case Size2i:
    pDVar1 = (DictionaryEntry *)operator_new(0x10);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_2iSize>::vtable;
    break;
  case Point2d:
    pDVar1 = (DictionaryEntry *)operator_new(0x18);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_2dPoint>::vtable;
    break;
  case Point3d:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_3dPoint>::vtable;
    break;
  case Point4d:
    pDVar1 = (DictionaryEntry *)operator_new(0x28);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[4]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_4dPoint>::vtable;
    break;
  case Vector2d:
    pDVar1 = (DictionaryEntry *)operator_new(0x18);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_2dVector>::vtable;
    break;
  case Vector3d:
    pDVar1 = (DictionaryEntry *)operator_new(0x20);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[3]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<ON_3dVector>::vtable;
    break;
  case ArchivableDictionary:
    pDVar1 = (DictionaryEntry *)operator_new(0x18);
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    puVar2 = &Entry<std::shared_ptr<ON_ArchivableDictionary>>::vtable;
    break;
  case Object:
    pDVar1 = (DictionaryEntry *)operator_new(0x18);
    pDVar1->_vptr_DictionaryEntry = (_func_int **)&PTR__DictionaryEntryT_0080a8d8;
    ON_Object::ON_Object((ON_Object *)(pDVar1 + 1));
    puVar2 = &Entry<ON_Object>::vtable;
    break;
  case MeshParameters:
    pDVar1 = (DictionaryEntry *)operator_new(0xe8);
    pDVar1->_vptr_DictionaryEntry = (_func_int **)&PTR__DictionaryEntry_0080a988;
    memset((ON_MeshParameters *)(pDVar1 + 1),0,0xe0);
    ON_MeshParameters::ON_MeshParameters((ON_MeshParameters *)(pDVar1 + 1));
    puVar2 = &Entry<ON_MeshParameters>::vtable;
    break;
  case Geometry:
    pDVar1 = (DictionaryEntry *)operator_new(0x18);
    pDVar1->_vptr_DictionaryEntry = (_func_int **)&PTR__DictionaryEntryT_0080aa38;
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)0x0;
    pDVar1[2]._vptr_DictionaryEntry = (_func_int **)0x0;
    ON_Object::ON_Object((ON_Object *)(pDVar1 + 1));
    pDVar1[1]._vptr_DictionaryEntry = (_func_int **)&PTR_ClassId_0080fb38;
    puVar2 = &Entry<ON_Geometry>::vtable;
  }
  pDVar1->_vptr_DictionaryEntry = (_func_int **)(puVar2 + 0x10);
switchD_0038c0a5_caseD_1a:
  return pDVar1;
}

Assistant:

DictionaryEntry* DictionaryEntry::CreateInstance(enum DictionaryEntryType item_type)
{
  switch (item_type)
  {
  // some basic data types
  case Entry<bool>::Type: return new Entry<bool>;
  case Entry<std::uint8_t>::Type: return new Entry<std::uint8_t>;
  case Entry<std::int8_t>::Type: return new Entry<std::int8_t>;
  case Entry<std::int16_t>::Type: return new Entry<std::int16_t>;
  case Entry<std::uint16_t>::Type: return new Entry<std::uint16_t>;
  case Entry<std::int32_t>::Type: return new Entry<std::int32_t>;
  case Entry<std::uint32_t>::Type: return new Entry<std::uint32_t>;
  case Entry<std::int64_t>::Type: return new Entry<std::int64_t>;
  case Entry<float>::Type: return new Entry<float>;
  case Entry<double>::Type: return new Entry<double>;
  case Entry<ON_UUID>::Type: return new Entry<ON_UUID>;
  case Entry<ON_wString>::Type: return new Entry<ON_wString>;

  // array of basic data types
  case Entry<ON_SimpleArray<bool>>::Type: return new Entry<ON_SimpleArray<bool>>;
  case Entry<ON_SimpleArray<std::uint8_t>>::Type: return new Entry<ON_SimpleArray<std::uint8_t>>;
  case Entry<ON_SimpleArray<std::int8_t>>::Type: return new Entry<ON_SimpleArray<std::int8_t>>;
  case Entry<ON_SimpleArray<std::int16_t>>::Type: return new Entry<ON_SimpleArray<std::int16_t>>;
  case Entry<ON_SimpleArray<std::int32_t>>::Type: return new Entry<ON_SimpleArray<std::int32_t>>;
  case Entry<ON_SimpleArray<float>>::Type: return new Entry<ON_SimpleArray<float>>;
  case Entry<ON_SimpleArray<double>>::Type: return new Entry<ON_SimpleArray<double>>;
  case Entry<ON_SimpleArray<ON_UUID>>::Type: return new Entry<ON_SimpleArray<ON_UUID>>;
  case Entry<ON_ClassArray<ON_wString>>::Type: return new Entry<ON_ClassArray<ON_wString>>;

  case Entry<ON_Color>::Type: return new Entry<ON_Color>;
  case Entry<ON_2iPoint>::Type: return new Entry<ON_2iPoint>;
  case Entry<ON_2fPoint>::Type: return new Entry<ON_2fPoint>;
  case Entry<ON_4iRect>::Type: return new Entry<ON_4iRect>;
  //case Entry<ON_4fRect>::Type: return new Entry<ON_4fRect>;
  case Entry<ON_2iSize>::Type: return new Entry<ON_2iSize>;
  //case Entry<ON_2fSize>::Type: return new Entry<ON_2fSize>;
  //case Entry<ON_Font>::Type: return new Entry<ON_Font>;

  //case Entry<ON_Interval>::Type: return new Entry<ON_Interval>;
  case Entry<ON_2dPoint>::Type: return new Entry<ON_2dPoint>;
  case Entry<ON_3dPoint>::Type: return new Entry<ON_3dPoint>;
  case Entry<ON_4dPoint>::Type: return new Entry<ON_4dPoint>;
  case Entry<ON_2dVector>::Type: return new Entry<ON_2dVector>;
  case Entry<ON_3dVector>::Type: return new Entry<ON_3dVector>;
  //case Entry<ON_BoundingBox>::Type: return new Entry<ON_BoundingBox>;
  //case Entry<ON_3dRay>::Type: return new Entry<ON_3dRay>;
  //case Entry<ON_PlaneEquation>::Type: return new Entry<ON_PlaneEquation>;
  //case Entry<ON_Xform>::Type: return new Entry<ON_Xform>;
  //case Entry<ON_Plane>::Type: return new Entry<ON_Plane>;
  //case Entry<ON_Line>::Type: return new Entry<ON_Line>;
  //case Entry<ON_3fPoint>::Type: return new Entry<ON_3fPoint>;
  //case Entry<ON_3fVector>::Type: return new Entry<ON_3fVector>;

  case DictionaryEntryType::Object: return new Entry<ON_Object>;
  case DictionaryEntryType::MeshParameters: return new Entry<ON_MeshParameters>;
  case DictionaryEntryType::Geometry: return new Entry<ON_Geometry>;
  case DictionaryEntryType::ArchivableDictionary: return new Entry<ON_ArchivableDictionaryPtr>;
  default: return nullptr;
  }
}